

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Teleport.cpp
# Opt level: O0

int Teleport::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  SharedMemory *pSVar1;
  float local_60;
  uint local_5c;
  float x_1;
  uint n_1;
  float x;
  uint n;
  Stream *s;
  SharedMemoryHandle *shared;
  EffectData *pEStack_38;
  int stream;
  EffectData *data;
  int local_28;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  data._4_4_ = outchannels;
  local_28 = inchannels;
  outchannels_local = length;
  _inchannels_local = outbuffer;
  outbuffer_local = inbuffer;
  inbuffer_local = (float *)state;
  pEStack_38 = UnityAudioEffectState::GetEffectData<Teleport::EffectData>(state);
  shared._4_4_ = (int)pEStack_38->p[0];
  if (shared._4_4_ < 0) {
    __assert_fail("stream >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/Plugin_Teleport.cpp"
                  ,0x3f,
                  "int Teleport::ProcessCallback(UnityAudioEffectState *, float *, float *, unsigned int, int, int)"
                 );
  }
  if (7 < shared._4_4_) {
    __assert_fail("stream < Teleport::NUMSTREAMS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/Plugin_Teleport.cpp"
                  ,0x40,
                  "int Teleport::ProcessCallback(UnityAudioEffectState *, float *, float *, unsigned int, int, int)"
                 );
  }
  s = (Stream *)GetSharedMemory();
  pSVar1 = SharedMemoryHandle::operator->((SharedMemoryHandle *)s);
  _x = pSVar1->streams + shared._4_4_;
  outchannels_local = data._4_4_ * outchannels_local;
  if (pEStack_38->p[1] < 0.5) {
    for (local_5c = 0; local_5c < (uint)outchannels_local; local_5c = local_5c + 1) {
      local_60 = 0.0;
      Stream::Read(_x,&local_60);
      _inchannels_local[local_5c] =
           outbuffer_local[local_5c] * pEStack_38->p[2] + local_60 * pEStack_38->p[3];
    }
  }
  else {
    for (n_1 = 0; n_1 < (uint)outchannels_local; n_1 = n_1 + 1) {
      x_1 = outbuffer_local[n_1];
      Stream::Feed(_x,x_1 * pEStack_38->p[3]);
      _inchannels_local[n_1] = x_1 * pEStack_38->p[2];
    }
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        int stream = (int)data->p[P_STREAM];
        assert(stream >= 0);
        assert(stream < Teleport::NUMSTREAMS);

        SharedMemoryHandle& shared = GetSharedMemory();
        Stream& s = shared->streams[stream];

        length *= outchannels;
        if (data->p[P_SEND] >= 0.5f)
        {
            for (unsigned int n = 0; n < length; n++)
            {
                float x = inbuffer[n];
                s.Feed(x * data->p[P_TELEPORTGAIN]);
                outbuffer[n] = x * data->p[P_INPUTGAIN];
            }
        }
        else
        {
            for (unsigned int n = 0; n < length; n++)
            {
                float x = 0.0f;
                s.Read(x);
                outbuffer[n] = inbuffer[n] * data->p[P_INPUTGAIN] + x * data->p[P_TELEPORTGAIN];
            }
        }

        return UNITY_AUDIODSP_OK;
    }